

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O0

String * __thiscall
LiteScript::Character::operator*(String *__return_storage_ptr__,Character *this,uint nb)

{
  char32_t *pcVar1;
  char32_t local_50;
  uint j;
  undefined1 local_40 [8];
  String cpy;
  uint nb_local;
  Character *this_local;
  String *res;
  
  cpy.str.field_2._M_local_buf[2]._3_1_ = 0;
  cpy.str.field_2._M_local_buf[3] = nb;
  String::String(__return_storage_ptr__);
  pcVar1 = String::operator[](this->str,this->i);
  String::String((String *)local_40,*pcVar1);
  for (local_50 = L'\0'; (uint)local_50 < (uint)cpy.str.field_2._M_local_buf[3];
      local_50 = local_50 + L'\x01') {
    String::operator+=(__return_storage_ptr__,(String *)local_40);
  }
  cpy.str.field_2._M_local_buf[2]._3_1_ = 1;
  String::~String((String *)local_40);
  if ((cpy.str.field_2._M_local_buf[2]._3_1_ & 1) == 0) {
    String::~String(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

LiteScript::String LiteScript::Character::operator*(unsigned int nb) const {
    String res, cpy(this->str[this->i]);
    for (unsigned int j = 0; j < nb; j++)
        res += cpy;
    return res;
}